

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSiteNameCommand.cxx
# Opt level: O0

bool cmSiteNameCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *args,cmExecutionStatus *status)

{
  cmExecutionStatus *this;
  bool bVar1;
  size_type sVar2;
  cmMakefile *pcVar3;
  const_reference pvVar4;
  string *psVar5;
  ulong uVar6;
  char *pcVar7;
  string_view val;
  allocator<char> local_3e9;
  string local_3e8;
  string local_3c8;
  undefined1 local_3a8 [8];
  RegularExpression hostReg;
  string local_170 [8];
  string hostRegExp;
  undefined1 local_148 [8];
  string host;
  allocator<char> local_111;
  undefined1 local_110 [8];
  string siteName;
  undefined1 local_d0 [8];
  string hostname_cmd;
  string local_a8;
  cmValue local_88;
  cmValue temp;
  cmValue local_78;
  cmValue cacheValue;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  this = local_20;
  if (sVar2 == 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&cacheValue);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[9]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cacheValue,
               (char (*) [9])"/usr/bsd");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[10]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cacheValue,
               (char (*) [10])"/usr/sbin");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[9]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cacheValue,
               (char (*) [9])"/usr/bin");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cacheValue,
               (char (*) [5])0x1149ab4);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[6]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cacheValue,
               (char (*) [6])0x1177142);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[15]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cacheValue,
               (char (*) [15])"/usr/local/bin");
    pcVar3 = cmExecutionStatus::GetMakefile(local_20);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,0);
    local_78 = cmMakefile::GetDefinition(pcVar3,pvVar4);
    bVar1 = cmValue::operator_cast_to_bool(&local_78);
    if (bVar1) {
      args_local._7_1_ = 1;
      temp.Value._4_4_ = 1;
    }
    else {
      pcVar3 = cmExecutionStatus::GetMakefile(local_20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"HOSTNAME",
                 (allocator<char> *)(hostname_cmd.field_2._M_local_buf + 0xf));
      local_88 = cmMakefile::GetDefinition(pcVar3,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator((allocator<char> *)(hostname_cmd.field_2._M_local_buf + 0xf))
      ;
      std::__cxx11::string::string((string *)local_d0);
      bVar1 = cmValue::operator_cast_to_bool(&local_88);
      if (bVar1) {
        psVar5 = cmValue::operator*[abi_cxx11_(&local_88);
        std::__cxx11::string::operator=((string *)local_d0,(string *)psVar5);
      }
      else {
        cmsys::SystemTools::FindProgram
                  ((string *)((long)&siteName.field_2 + 8),"hostname",
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&cacheValue,false);
        std::__cxx11::string::operator=
                  ((string *)local_d0,(string *)(siteName.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(siteName.field_2._M_local_buf + 8));
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_110,"unknown",&local_111);
      std::allocator<char>::~allocator(&local_111);
      val = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_d0);
      host.field_2._8_8_ = val._M_len;
      bVar1 = cmIsOff(val);
      if (!bVar1) {
        std::__cxx11::string::string((string *)local_148);
        hostRegExp.field_2._8_8_ = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
        cmSystemTools::RunSingleCommand
                  ((string *)local_d0,(string *)local_148,(string *)0x0,(int *)0x0,(char *)0x0,
                   OUTPUT_NONE,(cmDuration)hostRegExp.field_2._8_8_);
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_170,"[ \t\n\r]*([^\t\n\r ]*)[ \t\n\r]*",
                     (allocator<char> *)&hostReg.field_0x22f);
          std::allocator<char>::~allocator((allocator<char> *)&hostReg.field_0x22f);
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmsys::RegularExpression::RegularExpression((RegularExpression *)local_3a8,pcVar7);
          pcVar7 = (char *)std::__cxx11::string::c_str();
          bVar1 = cmsys::RegularExpression::find((RegularExpression *)local_3a8,pcVar7);
          if (bVar1) {
            cmsys::RegularExpression::match_abi_cxx11_(&local_3c8,(RegularExpression *)local_3a8,1);
            std::__cxx11::string::operator=((string *)local_148,(string *)&local_3c8);
            std::__cxx11::string::~string((string *)&local_3c8);
          }
          uVar6 = std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            std::__cxx11::string::operator=((string *)local_110,(string *)local_148);
          }
          cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_3a8);
          std::__cxx11::string::~string(local_170);
        }
        std::__cxx11::string::~string((string *)local_148);
      }
      pcVar3 = cmExecutionStatus::GetMakefile(local_20);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3e8,"Name of the computer/site where compile is being run",
                 &local_3e9);
      cmMakefile::AddCacheDefinition(pcVar3,pvVar4,(string *)local_110,&local_3e8,STRING,false);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::allocator<char>::~allocator(&local_3e9);
      args_local._7_1_ = 1;
      temp.Value._4_4_ = 1;
      std::__cxx11::string::~string((string *)local_110);
      std::__cxx11::string::~string((string *)local_d0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&cacheValue);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with incorrect number of arguments",&local_41);
    cmExecutionStatus::SetError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmSiteNameCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  if (args.size() != 1) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  std::vector<std::string> paths;
  paths.emplace_back("/usr/bsd");
  paths.emplace_back("/usr/sbin");
  paths.emplace_back("/usr/bin");
  paths.emplace_back("/bin");
  paths.emplace_back("/sbin");
  paths.emplace_back("/usr/local/bin");

  cmValue cacheValue = status.GetMakefile().GetDefinition(args[0]);
  if (cacheValue) {
    return true;
  }

  cmValue temp = status.GetMakefile().GetDefinition("HOSTNAME");
  std::string hostname_cmd;
  if (temp) {
    hostname_cmd = *temp;
  } else {
    hostname_cmd = cmSystemTools::FindProgram("hostname", paths);
  }

  std::string siteName = "unknown";
#if defined(_WIN32) && !defined(__CYGWIN__)
  std::string host;
  if (cmSystemTools::ReadRegistryValue(
        "HKEY_LOCAL_MACHINE\\System\\CurrentControlSet\\"
        "Control\\ComputerName\\ComputerName;ComputerName",
        host)) {
    siteName = host;
  }
#else
  // try to find the hostname for this computer
  if (!cmIsOff(hostname_cmd)) {
    std::string host;
    cmSystemTools::RunSingleCommand(hostname_cmd, &host, nullptr, nullptr,
                                    nullptr, cmSystemTools::OUTPUT_NONE);

    // got the hostname
    if (!host.empty()) {
      // remove any white space from the host name
      std::string hostRegExp = "[ \t\n\r]*([^\t\n\r ]*)[ \t\n\r]*";
      cmsys::RegularExpression hostReg(hostRegExp.c_str());
      if (hostReg.find(host.c_str())) {
        // strip whitespace
        host = hostReg.match(1);
      }

      if (!host.empty()) {
        siteName = host;
      }
    }
  }
#endif
  status.GetMakefile().AddCacheDefinition(
    args[0], siteName, "Name of the computer/site where compile is being run",
    cmStateEnums::STRING);

  return true;
}